

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryFill(TranslateToFuzzReader *this)

{
  Expression *pEVar1;
  Expression *value;
  Expression *size;
  MemoryFill *pMVar2;
  
  if (this->allowMemory != false) {
    pEVar1 = makePointer(this);
    value = make(this,(Type)0x2);
    size = make(this,(Type)*(uintptr_t *)
                            ((long)(((this->wasm->memories).
                                     super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                   super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                            + 0x50));
    pMVar2 = Builder::makeMemoryFill
                       (&this->builder,pEVar1,value,size,
                        (Name)*(string_view *)
                               (((this->wasm->memories).
                                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                       );
    return (Expression *)pMVar2;
  }
  pEVar1 = makeTrivial(this,(Type)0x0);
  return pEVar1;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryFill() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* value = make(Type::i32);
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryFill(dest, value, size, wasm.memories[0]->name);
}